

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<crnlib::vec<6U,_float>_> * __thiscall
crnlib::vector<crnlib::vec<6U,_float>_>::operator=
          (vector<crnlib::vec<6U,_float>_> *this,vector<crnlib::vec<6U,_float>_> *other)

{
  vector<crnlib::vec<6U,_float>_> *other_local;
  vector<crnlib::vec<6U,_float>_> *this_local;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    memcpy(this->m_p,other->m_p,(ulong)other->m_size * 0x18);
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }